

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setConstant(SignalPtr<double,_int> *this,double *t)

{
  double *pdVar1;
  _func_int *p_Var2;
  double *pdVar3;
  
  (*this->_vptr_SignalPtr[2])
            (this,(_func_int *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  p_Var2 = this->_vptr_SignalPtr[-3];
  *(undefined4 *)(&this->field_0x30 + (long)p_Var2) = 0;
  pdVar1 = (double *)(&this->field_0x40 + (long)p_Var2);
  pdVar3 = (double *)(&this->field_0x38 + (long)p_Var2);
  if (*(double **)(&this->field_0x48 + (long)p_Var2) == (double *)(&this->field_0x38 + (long)p_Var2)
     ) {
    pdVar3 = pdVar1;
  }
  *pdVar3 = *t;
  *(undefined1 *)(pdVar1 + 2) = 1;
  pdVar1[1] = (double)pdVar3;
  *(undefined1 *)((long)pdVar1 + -0x14) = 1;
  return;
}

Assistant:

virtual void setConstant(const T &t) {
    plug(this);
    Signal<T, Time>::setConstant(t);
  }